

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2c-wrapper.h
# Opt level: O1

string * __thiscall
wasm::wasm2cMangle_abi_cxx11_(string *__return_storage_ptr__,wasm *this,Name name,Signature sig)

{
  uint *puVar1;
  wasm wVar2;
  int iVar3;
  size_t sVar4;
  uintptr_t *puVar5;
  char cVar6;
  wasm *pwVar7;
  undefined1 local_1f8 [8];
  stringstream ss;
  long local_1e8 [3];
  uint auStack_1d0 [22];
  ios_base local_178 [264];
  size_t local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  Type local_60;
  Signature sig_local;
  anon_class_1_0_00000001 wasm2cSignature;
  long local_40 [2];
  
  sig_local.params = sig.params.id;
  local_60.id = name.super_IString.str._M_str;
  local_70 = name.super_IString.str._M_len;
  local_68 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"Z_","",local_60.id,sig_local.params.id,
             sig.results.id.id);
  cVar6 = (char)__return_storage_ptr__;
  if (this != (wasm *)0x0) {
    pwVar7 = (wasm *)0x0;
    do {
      wVar2 = pwVar7[local_70];
      iVar3 = isalnum((uint)(byte)wVar2);
      if ((wVar2 == (wasm)0x5f) || ((byte)wVar2 != 0x5a && iVar3 != 0)) {
        std::__cxx11::string::push_back(cVar6);
      }
      else {
        std::__cxx11::string::push_back(cVar6);
        std::__cxx11::stringstream::stringstream((stringstream *)local_1f8);
        *(uint *)((long)auStack_1d0 + *(long *)(local_1e8[0] + -0x18)) =
             *(uint *)((long)auStack_1d0 + *(long *)(local_1e8[0] + -0x18)) & 0xffffffb5 | 8;
        puVar1 = (uint *)((long)auStack_1d0 + *(long *)(local_1e8[0] + -0x18));
        *puVar1 = *puVar1 | 0x4000;
        std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,sig_local.results.id);
        if ((long *)sig_local.results.id != local_40) {
          operator_delete((void *)sig_local.results.id,local_40[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1f8);
        std::ios_base::~ios_base(local_178);
      }
      pwVar7 = pwVar7 + 1;
    } while (this != pwVar7);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  wasm2cMangle::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)&sig_local.results,sig_local.params);
  std::__cxx11::string::push_back(cVar6);
  if ((local_60.id & 1) == 0 || local_60.id < 7) {
    wasm2cMangle::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)&sig_local.results,local_60);
    std::__cxx11::string::push_back(cVar6);
  }
  else {
    _ss = 0;
    local_1f8 = (undefined1  [8])&local_60;
    sVar4 = Type::size(&local_60);
    if (_ss == sVar4) goto LAB_001cff89;
    do {
      do {
        puVar5 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)local_1f8);
        wasm2cMangle::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&sig_local.results,(Type)*puVar5);
        std::__cxx11::string::push_back(cVar6);
        _ss = _ss + 1;
      } while (_ss != sVar4);
LAB_001cff89:
    } while (local_1f8 != (undefined1  [8])&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string wasm2cMangle(Name name, Signature sig) {
  const char escapePrefix = 'Z';
  std::string mangled = "Z_";
  for (unsigned char c : name.str) {
    if ((isalnum(c) && c != escapePrefix) || c == '_') {
      // This character is ok to emit as it is.
      mangled += c;
    } else {
      // This must be escaped, as prefix + hex character code.
      mangled += escapePrefix;
      std::stringstream ss;
      ss << std::hex << std::uppercase << unsigned(c);
      mangled += ss.str();
    }
  }

  // Emit the result and params.
  mangled += "Z_";

  auto wasm2cSignature = [](Type type) {
    TODO_SINGLE_COMPOUND(type);
    switch (type.getBasic()) {
      case Type::none:
        return 'v';
      case Type::i32:
        return 'i';
      case Type::i64:
        return 'j';
      case Type::f32:
        return 'f';
      case Type::f64:
        return 'd';
      default:
        Fatal() << "unhandled wasm2c wrapper signature type: " << type;
    }
  };

  mangled += wasm2cSignature(sig.results);
  if (sig.params.isTuple()) {
    for (const auto& param : sig.params) {
      mangled += wasm2cSignature(param);
    }
  } else {
    mangled += wasm2cSignature(sig.params);
  }

  return mangled;
}